

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::add_include_once(CTcTokenizer *this,char *fname)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  char *in_RSI;
  char *in_RDI;
  tctok_incfile_t *prvinc;
  CTcTokenizer *in_stack_ffffffffffffffe8;
  
  iVar1 = find_include_once(in_stack_ffffffffffffffe8,in_RDI);
  if (iVar1 == 0) {
    sVar2 = strlen(in_RSI);
    puVar3 = (undefined8 *)malloc(sVar2 + 0x10);
    strcpy((char *)(puVar3 + 1),in_RSI);
    *puVar3 = *(undefined8 *)(in_RDI + 0x20);
    *(undefined8 **)(in_RDI + 0x20) = puVar3;
  }
  return;
}

Assistant:

void CTcTokenizer::add_include_once(const char *fname)
{
    tctok_incfile_t *prvinc;

    /* if the file is already in the list, don't add it again */
    if (find_include_once(fname))
        return;
    
    /* create a new entry for the filename */
    prvinc = (tctok_incfile_t *)t3malloc(sizeof(tctok_incfile_t)
                                         + strlen(fname));

    /* save the filename */
    strcpy(prvinc->fname, fname);
    
    /* link the new entry into our list */
    prvinc->nxt = prev_includes_;
    prev_includes_ = prvinc;
}